

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

uchar ** traverse<void(*)(unsigned_char**,int,int),vector_block<unsigned_char*,128u>,unsigned_char>
                   (TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *node,uchar **dst,
                   size_t depth,_func_void_uchar_ptr_ptr_int_int *small_sort)

{
  vector_block<unsigned_char_*,_128U> *v;
  bool bVar1;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_> *node_00;
  uint index;
  long lVar2;
  
  for (index = 0;
      (ulong)index <
      (ulong)((long)(node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3); index = index + 1) {
    bVar1 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_>::is_trie(node,index);
    if (bVar1) {
      node_00 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_128U>_>::get_node(node,index);
      dst = traverse<void(*)(unsigned_char**,int,int),vector_block<unsigned_char*,128u>,unsigned_char>
                      (node_00,dst,depth + 1,small_sort);
    }
    else {
      v = (vector_block<unsigned_char_*,_128U> *)
          (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Vector_impl_data._M_start[index];
      if (v != (vector_block<unsigned_char_*,_128U> *)0x0) {
        lVar2 = ((long)(v->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(v->_index_block).
                      super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                      _M_impl.super__Vector_impl_data._M_start) * 0x10 - (ulong)v->_left_in_block;
        copy<unsigned_char*,128u,unsigned_char**>(v,dst);
        if ((char)index != '\0') {
          mkqsort(dst,(int)lVar2,(int)depth);
        }
        dst = dst + lVar2;
        vector_block<unsigned_char_*,_128U>::~vector_block(v);
        operator_delete(v);
      }
    }
  }
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            ((_Vector_base<void_*,_std::allocator<void_*>_> *)node);
  operator_delete(node);
  return dst;
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT, BucketT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < node->_buckets.size(); ++i) {
		if (node->is_trie(i)) {
			dst = traverse(node->get_node(i),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->_buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}